

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_list::apply_ip_filter
          (peer_list *this,ip_filter *filter,torrent_state *state,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *banned)

{
  _Map_pointer ppptVar1;
  peer_connection_interface *ppVar2;
  _Map_pointer ppptVar3;
  _Map_pointer ppptVar4;
  _Elt_pointer pptVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  _Map_pointer ppptVar9;
  _Elt_pointer pptVar10;
  int __type;
  ulong uVar11;
  _Elt_pointer pptVar12;
  ulong uVar13;
  long lVar14;
  _Elt_pointer pptVar15;
  long lVar16;
  long lVar17;
  _Map_pointer ppptVar18;
  _Elt_pointer local_b0;
  undefined1 local_a0 [8];
  anon_union_16_3_a3f0114d_for___in6_u local_98;
  ulong local_88;
  peer_list *local_80;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *local_78;
  torrent_state *local_70;
  peer_connection_interface *local_68;
  long local_60;
  long local_58;
  iterator local_50;
  short *psVar8;
  
  pptVar12 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pptVar12 !=
      (this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_b0 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
    pptVar15 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptVar18 = (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_80 = this;
    local_78 = banned;
    local_70 = state;
    do {
      torrent_peer::address(*pptVar12);
      uVar6 = ip_filter::access(filter,local_a0,__type);
      if (((uVar6 & 1) == 0) || (*pptVar12 == this->m_locked_peer)) {
        pptVar12 = pptVar12 + 1;
        ppptVar9 = ppptVar18;
        pptVar10 = pptVar15;
        if (pptVar12 == pptVar15) {
          pptVar12 = ppptVar18[1];
          ppptVar9 = ppptVar18 + 1;
          pptVar10 = pptVar12 + 0x40;
          local_b0 = pptVar12;
        }
      }
      else {
        ppptVar1 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        lVar14 = (long)(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
        lVar16 = ((long)pptVar12 - (long)local_b0 >> 3) + lVar14 +
                 ((((ulong)((long)ppptVar18 - (long)ppptVar1) >> 3) - 1) +
                 (ulong)(ppptVar18 == (_Map_pointer)0x0)) * 0x40;
        ppVar2 = (*pptVar12)->connection;
        if (ppVar2 != (peer_connection_interface *)0x0) {
          ppptVar3 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          local_58 = (long)(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_68 = ppVar2;
          iVar7 = (*ppVar2->_vptr_peer_connection_interface[2])();
          psVar8 = (short *)CONCAT44(extraout_var,iVar7);
          if (*psVar8 != 2) {
            local_98._0_8_ = *(undefined8 *)(psVar8 + 4);
            local_98._8_8_ = *(undefined8 *)(psVar8 + 8);
            local_88 = (ulong)*(uint *)(psVar8 + 0xc);
            local_a0._4_4_ = 0;
          }
          else {
            local_a0._4_4_ = *(undefined4 *)(psVar8 + 2);
            local_98._0_8_ = 0;
            local_98._8_8_ = 0;
            local_88 = 0;
          }
          local_a0._1_3_ = 0;
          local_a0[0] = *psVar8 != 2;
          local_60 = lVar16;
          ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
          emplace_back<boost::asio::ip::address>(local_78,(address *)local_a0);
          _local_a0 = errors::make_error_code(banned_by_ip_filter);
          lVar17 = local_58 >> 3;
          (*local_68->_vptr_peer_connection_interface[4])(local_68,local_a0,1,0);
          ppptVar4 = (local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar9 = (local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          pptVar5 = (local_80->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar10 = (local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          this = local_80;
          lVar16 = local_60;
          if (((long)pptVar10 - (long)pptVar5 >> 3) +
              ((long)(local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppptVar4 - (long)ppptVar9) >> 3) - 1) +
              (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <
              lVar17 + lVar14 +
              ((((ulong)((long)ppptVar3 - (long)ppptVar1) >> 3) - 1) +
              (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40) {
            local_b0 = (local_80->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
            uVar13 = ((long)pptVar5 - (long)local_b0 >> 3) + (long)(int)local_60;
            if ((long)uVar13 < 0) {
              uVar11 = (long)uVar13 >> 6;
            }
            else {
              if (uVar13 < 0x40) {
                pptVar12 = pptVar5 + (int)local_60;
                goto LAB_0027fb6c;
              }
              uVar11 = uVar13 >> 6;
            }
            ppptVar9 = ppptVar9 + uVar11;
            local_b0 = *ppptVar9;
            pptVar10 = local_b0 + 0x40;
            pptVar12 = local_b0 + uVar13 + uVar11 * -0x40;
            goto LAB_0027fb6c;
          }
        }
        local_50._M_first = local_b0;
        local_50._M_cur = pptVar12;
        local_50._M_last = pptVar15;
        local_50._M_node = ppptVar18;
        erase_peer(this,&local_50,local_70);
        pptVar12 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b0 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        ppptVar9 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        uVar13 = ((long)pptVar12 - (long)local_b0 >> 3) + (long)(int)lVar16;
        if ((long)uVar13 < 0) {
          uVar11 = (long)uVar13 >> 6;
        }
        else {
          if (uVar13 < 0x40) {
            pptVar10 = (this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            pptVar12 = pptVar12 + (int)lVar16;
            goto LAB_0027fb6c;
          }
          uVar11 = uVar13 >> 6;
        }
        ppptVar9 = ppptVar9 + uVar11;
        local_b0 = *ppptVar9;
        pptVar10 = local_b0 + 0x40;
        pptVar12 = local_b0 + uVar13 + uVar11 * -0x40;
      }
LAB_0027fb6c:
      pptVar15 = pptVar10;
      ppptVar18 = ppptVar9;
    } while (pptVar12 !=
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void peer_list::apply_ip_filter(ip_filter const& filter
		, torrent_state* state, std::vector<address>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->address()) & ip_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				size_t count = m_peers.size();
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote().address());

				p->disconnect(errors::banned_by_ip_filter
					, operation_t::bittorrent);

				// what *i refers to has changed, i.e. cur was deleted
				if (m_peers.size() < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}